

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

int __thiscall Minisat::Solver::computeLBD<Minisat::Clause>(Solver *this,Clause *c)

{
  int iVar1;
  int iVar2;
  VarData *pVVar3;
  unsigned_long *puVar4;
  uint uVar5;
  anon_struct_8_10_eb538618_for_header aVar6;
  ulong uVar7;
  
  uVar5 = SUB84(c->header,4) >> 2;
  if ((int)uVar5 <= this->max_lbd_calc_size) {
    iVar1 = (this->assumptions).sz;
    this->counter = this->counter + 1;
    aVar6 = c->header;
    uVar5 = 0;
    if ((ulong)aVar6 >> 0x22 != 0) {
      pVVar3 = (this->vardata).data;
      puVar4 = (this->seen2).data;
      uVar7 = 0;
      uVar5 = 0;
      do {
        iVar2 = pVVar3[*(int *)(&c[1].header.field_0x0 + uVar7 * 4) >> 1].level;
        if ((iVar1 < iVar2) && (puVar4[iVar2] != this->counter)) {
          puVar4[iVar2] = this->counter;
          uVar5 = uVar5 + 1;
          aVar6 = c->header;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)aVar6 >> 0x22);
    }
  }
  return uVar5;
}

Assistant:

int size() const { return header.size; }